

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_uri.c
# Opt level: O0

ares_status_t ares_uri_set_query_key(ares_uri_t *uri,char *key,char *val)

{
  ares_bool_t aVar1;
  size_t sVar2;
  char *val_local;
  char *key_local;
  ares_uri_t *uri_local;
  
  if (((uri == (ares_uri_t *)0x0) || (key == (char *)0x0)) || (*key == '\0')) {
    return ARES_EFORMERR;
  }
  sVar2 = ares_strlen(key);
  aVar1 = ares_str_isprint(key,sVar2);
  if (aVar1 == ARES_FALSE) {
LAB_0013b535:
    uri_local._4_4_ = ARES_EBADSTR;
  }
  else {
    if (val != (char *)0x0) {
      sVar2 = ares_strlen(val);
      aVar1 = ares_str_isprint(val,sVar2);
      if (aVar1 == ARES_FALSE) goto LAB_0013b535;
    }
    aVar1 = ares_htable_dict_insert(uri->query,key,val);
    if (aVar1 == ARES_FALSE) {
      uri_local._4_4_ = ARES_ENOMEM;
    }
    else {
      uri_local._4_4_ = ARES_SUCCESS;
    }
  }
  return uri_local._4_4_;
}

Assistant:

ares_status_t ares_uri_set_query_key(ares_uri_t *uri, const char *key,
                                     const char *val)
{
  if (uri == NULL || key == NULL || *key == 0) {
    return ARES_EFORMERR;
  }

  if (!ares_str_isprint(key, ares_strlen(key)) ||
      (val != NULL && !ares_str_isprint(val, ares_strlen(val)))) {
    return ARES_EBADSTR;
  }

  if (!ares_htable_dict_insert(uri->query, key, val)) {
    return ARES_ENOMEM;
  }
  return ARES_SUCCESS;
}